

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EulerAngles *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Psi: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Psi);
  poVar1 = std::operator<<(poVar1,",  Theta: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Theta);
  poVar1 = std::operator<<(poVar1,",  Phi: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Phi);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString EulerAngles::GetAsString() const
{
    KStringStream ss;

    ss << "Psi: "       << m_f32Psi
       << ",  Theta: "  << m_f32Theta
       << ",  Phi: "    << m_f32Phi << "\n";

    return ss.str();
}